

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

bool __thiscall QAccessibleTable::unselectColumn(QAccessibleTable *this,int column)

{
  bool bVar1;
  SelectionMode SVar2;
  int iVar3;
  QFlags<QItemSelectionModel::SelectionFlag> QVar4;
  QAbstractItemModel *pQVar5;
  QItemSelectionModel *pQVar6;
  QAbstractItemModel *pQVar7;
  ulong uVar8;
  int in_ESI;
  enum_type f2;
  long *in_RDI;
  long in_FS_OFFSET;
  QItemSelectionModel *selectionModel;
  QAbstractItemModel *theModel;
  QAbstractItemView *theView;
  QItemSelection selection;
  QModelIndex index;
  QModelIndex rootIndex;
  undefined7 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1f;
  QModelIndex *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  bool local_89;
  undefined1 local_88 [24];
  QItemSelection local_70;
  QItemSelection local_58;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  view((QAccessibleTable *)0x7f46f4);
  pQVar5 = QAbstractItemView::model
                     ((QAbstractItemView *)
                      CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  pQVar6 = QAbstractItemView::selectionModel((QAbstractItemView *)in_stack_ffffffffffffff20);
  if ((pQVar5 == (QAbstractItemModel *)0x0) || (pQVar6 == (QItemSelectionModel *)0x0)) {
    local_89 = false;
    goto LAB_007f4999;
  }
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::rootIndex((QAbstractItemView *)in_stack_ffffffffffffff20);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  view((QAccessibleTable *)0x7f47a7);
  pQVar7 = QAbstractItemView::model
                     ((QAbstractItemView *)
                      CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  (**(code **)(*(long *)pQVar7 + 0x60))(&local_38,pQVar7,0,in_ESI,&local_20);
  bVar1 = QModelIndex::isValid(in_stack_ffffffffffffff20);
  if (!bVar1) {
    local_89 = false;
    goto LAB_007f4999;
  }
  local_58.super_QList<QItemSelectionRange>.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.super_QList<QItemSelectionRange>.d.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.super_QList<QItemSelectionRange>.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelection::QItemSelection(&local_58,(QModelIndex *)&local_38,(QModelIndex *)&local_38);
  view((QAccessibleTable *)0x7f482c);
  SVar2 = QAbstractItemView::selectionMode((QAbstractItemView *)in_stack_ffffffffffffff20);
  f2 = (enum_type)pQVar6;
  if (SVar2 == SingleSelection) {
    iVar3 = (**(code **)(*in_RDI + 0x48))();
    if (iVar3 != 1) goto LAB_007f494b;
    local_89 = false;
  }
  else {
    if (SVar2 == ContiguousSelection) {
      iVar3 = (**(code **)(*in_RDI + 0x48))();
      if (iVar3 == 1) {
        local_89 = false;
        goto LAB_007f498c;
      }
      if (((in_ESI == 0) ||
          (uVar8 = QItemSelectionModel::isColumnSelected(f2,(QModelIndex *)(ulong)(in_ESI - 1)),
          (uVar8 & 1) != 0)) &&
         (uVar8 = QItemSelectionModel::isColumnSelected(f2,(QModelIndex *)(ulong)(in_ESI + 1)),
         (uVar8 & 1) != 0)) {
        iVar3 = (**(code **)(*in_RDI + 0x58))();
        (**(code **)(*(long *)pQVar5 + 0x60))(local_88,pQVar5,0,iVar3 + -1,&local_20);
        QItemSelection::QItemSelection(&local_70,(QModelIndex *)&local_38,(QModelIndex *)local_88);
        QItemSelection::operator=
                  ((QItemSelection *)in_stack_ffffffffffffff20,
                   (QItemSelection *)CONCAT17(in_stack_ffffffffffffff1f,in_stack_ffffffffffffff18));
        QItemSelection::~QItemSelection((QItemSelection *)0x7f4947);
      }
    }
LAB_007f494b:
    QVar4 = ::operator|((enum_type)((ulong)pQVar6 >> 0x20),f2);
    (**(code **)(*(long *)pQVar6 + 0x70))
              (pQVar6,&local_58,
               QVar4.super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>.
               super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
    local_89 = true;
  }
LAB_007f498c:
  QItemSelection::~QItemSelection((QItemSelection *)0x7f4999);
LAB_007f4999:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_89;
}

Assistant:

bool QAccessibleTable::unselectColumn(int column)
{
    const QAbstractItemView *theView = view();
    const QAbstractItemModel *theModel = theView->model();
    auto *selectionModel = theView->selectionModel();
    if (!theModel || !selectionModel)
        return false;

    const QModelIndex rootIndex = theView->rootIndex();
    const QModelIndex index = view()->model()->index(0, column, rootIndex);
    if (!index.isValid())
        return false;

    QItemSelection selection(index, index);

    switch (view()->selectionMode()) {
    case QAbstractItemView::SingleSelection:
        //In SingleSelection and ContiguousSelection once an item
        //is selected, there's no way for the user to unselect all items
        if (selectedColumnCount() == 1)
            return false;
        break;
    case QAbstractItemView::ContiguousSelection:
        if (selectedColumnCount() == 1)
            return false;

        if ((!column || selectionModel->isColumnSelected(column - 1, rootIndex))
            && selectionModel->isColumnSelected(column + 1, rootIndex)) {
            //If there are columns selected both at the left of the current row and at the right
            //of the current rown, the ones which are at the right will be deselected
            selection = QItemSelection(index, theModel->index(0, columnCount() - 1, rootIndex));
        }
        break;
    default:
        break;
    }

    selectionModel->select(selection, QItemSelectionModel::Deselect | QItemSelectionModel::Columns);
    return true;
}